

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall
TGenericArray<unsigned_int>::LoadFromStream(TGenericArray<unsigned_int> *this,TByteStream *InStream)

{
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  DWORD NumberOfBytes;
  
  NumberOfBytes = (DWORD)((ulong)in_RAX >> 0x20);
  iVar1 = TByteStream::GetArrayItemCount<unsigned_int>(InStream,&NumberOfBytes,&this->ItemCount);
  if (iVar1 == 0) {
    iVar1 = TByteStream::GetArray<unsigned_int>(InStream,&this->ItemArray,(ulong)this->ItemCount);
    if (iVar1 == 0) {
      uVar2 = (ulong)(-NumberOfBytes & 7);
      iVar1 = 1000;
      if (uVar2 <= InStream->cbByteData) {
        InStream->pbByteData = InStream->pbByteData + uVar2;
        InStream->cbByteData = InStream->cbByteData - uVar2;
        if (this->bIsValidArray == false) {
          this->bIsValidArray = true;
          iVar1 = 0;
        }
        else {
          iVar1 = 0x11;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD NumberOfBytes;
        int nError;

        // Get and verify the number of items
        nError = InStream.GetArrayItemCount<T>(NumberOfBytes, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        // Get the pointer to the array
        nError = InStream.GetArray<T>(&ItemArray, ItemCount);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.SkipBytes((0 - (DWORD)NumberOfBytes) & 0x07);
        if(nError != ERROR_SUCCESS)
            return nError;

        return SetArrayValid();
    }